

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_int(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_7f8;
  StrX local_7e8;
  char *local_7d8;
  char *actRetCanRep_inchar_5;
  wchar16 *local_7c0;
  XMLCh *actRetCanRep_9;
  undefined1 local_7b0 [4];
  Status myStatus_23;
  StrX local_7a0;
  char *local_790;
  char *actRetCanRep_inchar_4;
  wchar16 *local_778;
  XMLCh *actRetCanRep_8;
  undefined1 local_768 [4];
  Status myStatus_22;
  StrX local_758;
  StrX local_748;
  long local_738;
  XMLCh *actRetCanRep_7;
  undefined1 local_728 [4];
  Status myStatus_21;
  StrX local_718;
  StrX local_708;
  long local_6f8;
  XMLCh *actRetCanRep_6;
  undefined1 local_6e8 [4];
  Status myStatus_20;
  StrX local_6d8;
  StrX local_6c8;
  long local_6b8;
  XMLCh *actRetCanRep_5;
  undefined1 local_6a8 [4];
  Status myStatus_19;
  StrX local_698;
  StrX local_688;
  long local_678;
  XMLCh *actRetCanRep_4;
  undefined1 local_668 [4];
  Status myStatus_18;
  StrX local_658;
  char *local_648;
  char *actRetCanRep_inchar_3;
  wchar16 *local_630;
  XMLCh *actRetCanRep_3;
  undefined1 local_620 [4];
  Status myStatus_17;
  StrX local_610;
  char *local_600;
  char *actRetCanRep_inchar_2;
  wchar16 *local_5e8;
  XMLCh *actRetCanRep_2;
  undefined1 local_5d8 [4];
  Status myStatus_16;
  StrX local_5c8;
  char *local_5b8;
  char *actRetCanRep_inchar_1;
  wchar16 *local_5a0;
  XMLCh *actRetCanRep_1;
  undefined1 local_590 [4];
  Status myStatus_15;
  StrX local_580;
  char *local_570;
  char *actRetCanRep_inchar;
  wchar16 *local_558;
  XMLCh *actRetCanRep;
  Status myStatus_14;
  int j;
  StrX local_538;
  StrX local_528;
  XSValue *local_518;
  XSValue *actRetValue_6;
  undefined1 local_508 [4];
  Status myStatus_13;
  StrX local_4f8;
  StrX local_4e8;
  XSValue *local_4d8;
  XSValue *actRetValue_5;
  undefined1 local_4c8 [4];
  Status myStatus_12;
  StrX local_4b8;
  StrX local_4a8;
  XSValue *local_498;
  XSValue *actRetValue_4;
  undefined1 local_488 [4];
  Status myStatus_11;
  StrX local_478;
  StrX local_468;
  XSValue *local_458;
  XSValue *actRetValue_3;
  undefined1 local_448 [4];
  Status myStatus_10;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  StrX local_3e8;
  XSValue *local_3d8;
  XSValue *actRetValue_2;
  undefined1 local_3c8 [4];
  Status myStatus_9;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  StrX local_368;
  XSValue *local_358;
  XSValue *actRetValue_1;
  undefined1 local_348 [4];
  Status myStatus_8;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  StrX local_2e8;
  XSValue *local_2d8;
  XSValue *actRetValue;
  Status myStatus_7;
  int i;
  StrX local_2b8;
  StrX local_2a8;
  byte local_295;
  Status local_294;
  undefined1 local_290 [3];
  bool actRetValid_6;
  Status myStatus_6;
  StrX local_280;
  StrX local_270;
  byte local_25d;
  Status local_25c;
  undefined1 local_258 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_248;
  StrX local_238;
  byte local_225;
  Status local_224;
  undefined1 local_220 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_210;
  StrX local_200;
  byte local_1ed;
  Status local_1ec;
  undefined1 local_1e8 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_1d8;
  byte local_1c5;
  Status local_1c4;
  undefined1 local_1c0 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_1b0;
  byte local_19d;
  Status local_19c;
  undefined1 local_198 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_178;
  byte local_165;
  Status local_164;
  char acStack_160 [3];
  bool actRetValid;
  Status myStatus;
  char data_canrep_2 [6];
  char data_rawstr_2 [9];
  char data_canrep_1 [6];
  char data_rawstr_1 [14];
  char lex_iv_2 [8];
  char lex_iv_1 [9];
  char lex_v_ran_iv_2_canrep [12];
  char lex_v_ran_iv_1_canrep [11];
  char lex_v_ran_v_2_canrep [12];
  char lex_v_ran_v_1_canrep [11];
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  XSValue_Data act_v_ran_v_0;
  char lex_v_ran_iv_2 [12];
  char lex_v_ran_iv_1 [12];
  char lex_v_ran_v_2 [12];
  char lex_v_ran_v_1 [12];
  char lex_v_ran_v_0 [15];
  bool toValidate;
  DataType dt;
  
  stack0xffffffffffffffe0 = 0x33323120202020;
  stack0xffffffffffffffd0 = 0x333834373431322b;
  lex_v_ran_v_1[0] = '6';
  lex_v_ran_v_1[1] = '4';
  lex_v_ran_v_1[2] = '7';
  lex_v_ran_v_1[3] = '\0';
  stack0xffffffffffffffc0 = 0x333834373431322d;
  lex_v_ran_v_2[0] = '6';
  lex_v_ran_v_2[1] = '4';
  lex_v_ran_v_2[2] = '8';
  lex_v_ran_v_2[3] = '\0';
  stack0xffffffffffffffb0 = 0x333834373431322b;
  lex_v_ran_iv_1[0] = '6';
  lex_v_ran_iv_1[1] = '4';
  lex_v_ran_iv_1[2] = '8';
  lex_v_ran_iv_1[3] = '\0';
  act_v_ran_v_0.fValue.f_datetime.f_milisec = 5.883658537827953e-62;
  lex_v_ran_iv_2[0] = '6';
  lex_v_ran_iv_2[1] = '4';
  lex_v_ran_iv_2[2] = '9';
  lex_v_ran_iv_2[3] = '\0';
  act_v_ran_v_0.f_datatype = 0x4d2;
  act_v_ran_v_1.f_datatype = 0x7fffffff;
  act_v_ran_v_2.f_datatype = 0x80000000;
  stack0xffffffffffffff18 = 0x33383437343132;
  stack0xffffffffffffff08 = 0x333834373431322d;
  lex_v_ran_v_2_canrep[0] = '6';
  lex_v_ran_v_2_canrep[1] = '4';
  lex_v_ran_v_2_canrep[2] = '8';
  lex_v_ran_v_2_canrep[3] = '\0';
  stack0xfffffffffffffef8 = 0x33383437343132;
  stack0xfffffffffffffee8 = 0x333834373431322d;
  lex_v_ran_iv_2_canrep[0] = '6';
  lex_v_ran_iv_2_canrep[1] = '4';
  lex_v_ran_iv_2_canrep[2] = '9';
  lex_v_ran_iv_2_canrep[3] = '\0';
  builtin_strncpy(lex_iv_2,"1234.456",8);
  lex_iv_1[0] = '\0';
  stack0xfffffffffffffed0 = 0x36356234333231;
  data_rawstr_1[0] = '4';
  data_rawstr_1[1] = '5';
  data_rawstr_1[2] = ' ';
  data_rawstr_1[3] = ' ';
  data_rawstr_1[4] = '\n';
  data_rawstr_1[5] = '\0';
  builtin_strncpy(data_canrep_1,"    +1",6);
  stack0xfffffffffffffeb8 = 0x34333231;
  _data_canrep_2 = 0x3534333231303030;
  data_rawstr_2[0] = '\0';
  myStatus._0_2_ = 0x35;
  _acStack_160 = 0x34333231;
  local_164 = st_Init;
  StrX::StrX(&local_178,lex_v_ran_v_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_178);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_int,&local_164,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  StrX::~StrX(&local_178);
  local_165 = bVar1 & 1;
  if (local_165 != 1) {
    pXVar3 = getDataTypeString(dt_int);
    StrX::StrX((StrX *)local_198,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_198);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x788,lex_v_ran_v_1 + 8,pcVar4,1);
    StrX::~StrX((StrX *)local_198);
    errSeen = true;
  }
  local_19c = st_Init;
  StrX::StrX(&local_1b0,lex_v_ran_v_2 + 8);
  pXVar3 = StrX::unicodeForm(&local_1b0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_int,&local_19c,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  StrX::~StrX(&local_1b0);
  local_19d = bVar1 & 1;
  if (local_19d != 1) {
    pXVar3 = getDataTypeString(dt_int);
    StrX::StrX((StrX *)local_1c0,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_1c0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x789,lex_v_ran_v_2 + 8,pcVar4,1);
    StrX::~StrX((StrX *)local_1c0);
    errSeen = true;
  }
  local_1c4 = st_Init;
  StrX::StrX(&local_1d8,lex_v_ran_iv_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_1d8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_int,&local_1c4,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  StrX::~StrX(&local_1d8);
  local_1c5 = bVar1 & 1;
  if (local_1c5 != 1) {
    pXVar3 = getDataTypeString(dt_int);
    StrX::StrX((StrX *)local_1e8,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_1e8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x78a,lex_v_ran_iv_1 + 8,pcVar4,1);
    StrX::~StrX((StrX *)local_1e8);
    errSeen = true;
  }
  local_1ec = st_Init;
  StrX::StrX(&local_200,lex_v_ran_iv_2 + 8);
  pXVar3 = StrX::unicodeForm(&local_200);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_int,&local_1ec,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  StrX::~StrX(&local_200);
  local_1ed = bVar1 & 1;
  if (local_1ed == 0) {
    if (local_1ec != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)local_220,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_220);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_1ec);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x78d,lex_v_ran_iv_2 + 8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_220);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_int);
    StrX::StrX(&local_210,pXVar3);
    pcVar4 = StrX::localForm(&local_210);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x78d,lex_v_ran_iv_2 + 8,pcVar4,0);
    StrX::~StrX(&local_210);
    errSeen = true;
  }
  local_224 = st_Init;
  StrX::StrX(&local_238,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_238);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_int,&local_224,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  StrX::~StrX(&local_238);
  local_225 = bVar1 & 1;
  if (local_225 == 0) {
    if (local_224 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)local_258,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_258);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_224);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x78e,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_258);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_int);
    StrX::StrX(&local_248,pXVar3);
    pcVar4 = StrX::localForm(&local_248);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x78e,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,0);
    StrX::~StrX(&local_248);
    errSeen = true;
  }
  local_25c = st_Init;
  StrX::StrX(&local_270,lex_iv_2);
  pXVar3 = StrX::unicodeForm(&local_270);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_int,&local_25c,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  StrX::~StrX(&local_270);
  local_25d = bVar1 & 1;
  if (local_25d == 0) {
    if (local_25c != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)local_290,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_290);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_25c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x791,lex_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_290);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_int);
    StrX::StrX(&local_280,pXVar3);
    pcVar4 = StrX::localForm(&local_280);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x791,lex_iv_2,pcVar4,0);
    StrX::~StrX(&local_280);
    errSeen = true;
  }
  local_294 = st_Init;
  StrX::StrX(&local_2a8,data_rawstr_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_2a8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_int,&local_294,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  StrX::~StrX(&local_2a8);
  local_295 = bVar1 & 1;
  if (local_295 == 0) {
    if (local_294 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)&myStatus_7,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_7);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_294);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x792,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_7);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_int);
    StrX::StrX(&local_2b8,pXVar3);
    pcVar4 = StrX::localForm(&local_2b8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x792,data_rawstr_1 + 8,pcVar4,0);
    StrX::~StrX(&local_2b8);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_2e8,lex_v_ran_v_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_2e8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_int,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2e8);
    local_2d8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)local_348,pXVar3);
      StrX::localForm((StrX *)local_348);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7af,lex_v_ran_v_1 + 8);
      StrX::~StrX((StrX *)local_348);
      errSeen = true;
    }
    else {
      memcpy(&local_310,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_1.fValue + 0x18);
      memcpy(&local_338,pvVar10,0x28);
      actValue.fValue.f_long = uStack_308;
      actValue._0_8_ = local_310;
      actValue.fValue._8_8_ = local_300;
      actValue.fValue._16_8_ = uStack_2f8;
      actValue.fValue.f_datetime.f_milisec = (double)local_2f0;
      expValue.fValue.f_long = uStack_330;
      expValue._0_8_ = local_338;
      expValue.fValue._8_8_ = local_328;
      expValue.fValue._16_8_ = uStack_320;
      expValue.fValue.f_datetime.f_milisec = (double)local_318;
      bVar2 = compareActualValue(dt_int,actValue,expValue);
      pXVar5 = local_2d8;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_2d8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2d8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_368,lex_v_ran_v_2 + 8);
    pXVar3 = StrX::unicodeForm(&local_368);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_int,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_368);
    local_358 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)local_3c8,pXVar3);
      StrX::localForm((StrX *)local_3c8);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b1,lex_v_ran_v_2 + 8);
      StrX::~StrX((StrX *)local_3c8);
      errSeen = true;
    }
    else {
      memcpy(&local_390,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_3b8,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_388;
      actValue_00._0_8_ = local_390;
      actValue_00.fValue._8_8_ = local_380;
      actValue_00.fValue._16_8_ = uStack_378;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_370;
      expValue_00.fValue.f_long = uStack_3b0;
      expValue_00._0_8_ = local_3b8;
      expValue_00.fValue._8_8_ = local_3a8;
      expValue_00.fValue._16_8_ = uStack_3a0;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_398;
      bVar2 = compareActualValue(dt_int,actValue_00,expValue_00);
      pXVar5 = local_358;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_358 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_358);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_3e8,lex_v_ran_iv_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_3e8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_int,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3e8);
    local_3d8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)local_448,pXVar3);
      StrX::localForm((StrX *)local_448);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b2,lex_v_ran_iv_1 + 8);
      StrX::~StrX((StrX *)local_448);
      errSeen = true;
    }
    else {
      memcpy(&local_410,pXVar5,0x28);
      pcVar4 = lex_v_ran_v_1_canrep + 8;
      memcpy(&local_438,pcVar4,0x28);
      actValue_01.fValue.f_long = uStack_408;
      actValue_01._0_8_ = local_410;
      actValue_01.fValue._8_8_ = local_400;
      actValue_01.fValue._16_8_ = uStack_3f8;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_3f0;
      expValue_01.fValue.f_long = uStack_430;
      expValue_01._0_8_ = local_438;
      expValue_01.fValue._8_8_ = local_428;
      expValue_01.fValue._16_8_ = uStack_420;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_418;
      bVar2 = compareActualValue(dt_int,actValue_01,expValue_01);
      pXVar5 = local_3d8;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_3d8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_3d8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pcVar4);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_468,lex_v_ran_iv_2 + 8);
    pXVar3 = StrX::unicodeForm(&local_468);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_int,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    local_458 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_int);
        StrX::StrX((StrX *)local_488,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_488);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x7b3,lex_v_ran_iv_2 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_488);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX(&local_478,pXVar3);
      StrX::localForm(&local_478);
      pvVar10 = (void *)0x7b3;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b3,lex_v_ran_iv_2 + 8);
      StrX::~StrX(&local_478);
      pXVar5 = local_458;
      errSeen = true;
      if (local_458 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_458);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_4a8,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_4a8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_int,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4a8);
    local_498 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_int);
        StrX::StrX((StrX *)local_4c8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_4c8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x7b4,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_4c8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX(&local_4b8,pXVar3);
      StrX::localForm(&local_4b8);
      pvVar10 = (void *)0x7b4;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b4,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18));
      StrX::~StrX(&local_4b8);
      pXVar5 = local_498;
      errSeen = true;
      if (local_498 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_498);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_4e8,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_4e8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_int,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4e8);
    local_4d8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_int);
        StrX::StrX((StrX *)local_508,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_508);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_5._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x7b6,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_508);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX(&local_4f8,pXVar3);
      StrX::localForm(&local_4f8);
      pvVar10 = (void *)0x7b6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b6,lex_iv_2);
      StrX::~StrX(&local_4f8);
      pXVar5 = local_4d8;
      errSeen = true;
      if (local_4d8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_4d8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_6._4_4_ = st_Init;
    StrX::StrX(&local_528,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_528);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_int,(Status *)((long)&actRetValue_6 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_528);
    local_518 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_6._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_int);
        StrX::StrX((StrX *)&myStatus_14,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_14);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_6._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x7b7,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_14);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX(&local_538,pXVar3);
      StrX::localForm(&local_538);
      pvVar10 = (void *)0x7b7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7b7,data_rawstr_1 + 8);
      StrX::~StrX(&local_538);
      pXVar5 = local_518;
      errSeen = true;
      if (local_518 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_518);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,data_canrep_1);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_int,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_558 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)local_590,pXVar3);
      StrX::localForm((StrX *)local_590);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7d5,data_canrep_1);
      StrX::~StrX((StrX *)local_590);
      errSeen = true;
    }
    else {
      local_570 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_570,data_rawstr_2 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_int);
        StrX::StrX(&local_580,pXVar3);
        pcVar4 = StrX::localForm(&local_580);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x7d5,data_canrep_1,pcVar4,local_570,data_rawstr_2 + 8);
        StrX::~StrX(&local_580);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_558);
      xercesc_4_0::XMLString::release(&local_570,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,data_canrep_2);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_int,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_5a0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)local_5d8,pXVar3);
      StrX::localForm((StrX *)local_5d8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7d6,data_canrep_2);
      StrX::~StrX((StrX *)local_5d8);
      errSeen = true;
    }
    else {
      local_5b8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_5b8,acStack_160);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_int);
        StrX::StrX(&local_5c8,pXVar3);
        pcVar4 = StrX::localForm(&local_5c8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x7d6,data_canrep_2,pcVar4,local_5b8,acStack_160);
        StrX::~StrX(&local_5c8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5a0);
      xercesc_4_0::XMLString::release(&local_5b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,lex_v_ran_v_2 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_int,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_5e8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)local_620,pXVar3);
      StrX::localForm((StrX *)local_620);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7d8,lex_v_ran_v_2 + 8);
      StrX::~StrX((StrX *)local_620);
      errSeen = true;
    }
    else {
      local_600 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_600,lex_v_ran_v_2_canrep + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_int);
        StrX::StrX(&local_610,pXVar3);
        pcVar4 = StrX::localForm(&local_610);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x7d8,lex_v_ran_v_2 + 8,pcVar4,local_600,lex_v_ran_v_2_canrep + 8);
        StrX::~StrX(&local_610);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5e8);
      xercesc_4_0::XMLString::release(&local_600,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_3,lex_v_ran_iv_1 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_3);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_int,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_3);
    local_630 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)local_668,pXVar3);
      StrX::localForm((StrX *)local_668);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7d9,lex_v_ran_iv_1 + 8);
      StrX::~StrX((StrX *)local_668);
      errSeen = true;
    }
    else {
      local_648 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_648,lex_v_ran_iv_1_canrep + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_int);
        StrX::StrX(&local_658,pXVar3);
        pcVar4 = StrX::localForm(&local_658);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x7d9,lex_v_ran_iv_1 + 8,pcVar4,local_648,lex_v_ran_iv_1_canrep + 8);
        StrX::~StrX(&local_658);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_630);
      xercesc_4_0::XMLString::release(&local_648,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_688,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_688);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_int,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_688);
    local_678 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_int);
        StrX::StrX((StrX *)local_6a8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_6a8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x7db,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_6a8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX(&local_698,pXVar3);
      StrX::localForm(&local_698);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7db,lex_iv_2);
      StrX::~StrX(&local_698);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_678);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_6c8,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_6c8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_int,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_6c8);
    local_6b8 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_int);
        StrX::StrX((StrX *)local_6e8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_6e8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x7dc,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_6e8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX(&local_6d8,pXVar3);
      StrX::localForm(&local_6d8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x7dc,data_rawstr_1 + 8);
      StrX::~StrX(&local_6d8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6b8);
      errSeen = true;
    }
  }
  actRetCanRep_6._4_4_ = st_Init;
  StrX::StrX(&local_708,lex_v_ran_iv_2 + 8);
  pXVar3 = StrX::unicodeForm(&local_708);
  lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (pXVar3,dt_int,(Status *)((long)&actRetCanRep_6 + 4),ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_708);
  local_6f8 = lVar9;
  if (lVar9 == 0) {
    if (actRetCanRep_6._4_4_ != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)local_728,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_728);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(actRetCanRep_6._4_4_);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x7e1,lex_v_ran_iv_2 + 8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_728);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_int);
    StrX::StrX(&local_718,pXVar3);
    StrX::localForm(&local_718);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7e1,lex_v_ran_iv_2 + 8);
    StrX::~StrX(&local_718);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6f8);
    errSeen = true;
  }
  actRetCanRep_7._4_4_ = st_Init;
  StrX::StrX(&local_748,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_748);
  lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (pXVar3,dt_int,(Status *)((long)&actRetCanRep_7 + 4),ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_748);
  local_738 = lVar9;
  if (lVar9 == 0) {
    if (actRetCanRep_7._4_4_ != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX((StrX *)local_768,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_768);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(actRetCanRep_7._4_4_);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x7e2,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_768);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_int);
    StrX::StrX(&local_758,pXVar3);
    pcVar4 = StrX::localForm(&local_758);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7e2,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4);
    StrX::~StrX(&local_758);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_738);
    errSeen = true;
  }
  actRetCanRep_8._4_4_ = 0;
  StrX::StrX((StrX *)&actRetCanRep_inchar_4,lex_v_ran_iv_2 + 8);
  pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_4);
  pwVar8 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (pXVar3,dt_int,(Status *)((long)&actRetCanRep_8 + 4),ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX((StrX *)&actRetCanRep_inchar_4);
  local_778 = pwVar8;
  if (pwVar8 == (wchar16 *)0x0) {
    pXVar3 = getDataTypeString(dt_int);
    StrX::StrX((StrX *)local_7b0,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_7b0);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7e5,lex_v_ran_iv_2 + 8,pcVar4);
    StrX::~StrX((StrX *)local_7b0);
    errSeen = true;
  }
  else {
    local_790 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar11 = xercesc_4_0::XMLString::equals(local_790,lex_v_ran_iv_2_canrep + 8);
    if (!bVar11) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX(&local_7a0,pXVar3);
      pcVar4 = StrX::localForm(&local_7a0);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x7e5,lex_v_ran_iv_2 + 8,pcVar4,local_790,lex_v_ran_iv_2_canrep + 8);
      StrX::~StrX(&local_7a0);
      errSeen = true;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_778);
    xercesc_4_0::XMLString::release(&local_790,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  actRetCanRep_9._4_4_ = 0;
  StrX::StrX((StrX *)&actRetCanRep_inchar_5,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_5);
  pwVar8 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (pXVar3,dt_int,(Status *)((long)&actRetCanRep_9 + 4),ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX((StrX *)&actRetCanRep_inchar_5);
  local_7c0 = pwVar8;
  if (pwVar8 == (wchar16 *)0x0) {
    pXVar3 = getDataTypeString(dt_int);
    StrX::StrX(&local_7f8,pXVar3);
    pcVar4 = StrX::localForm(&local_7f8);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x7e6,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4);
    StrX::~StrX(&local_7f8);
    errSeen = true;
  }
  else {
    local_7d8 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar11 = xercesc_4_0::XMLString::equals(local_7d8,lex_iv_1 + 8);
    if (!bVar11) {
      pXVar3 = getDataTypeString(dt_int);
      StrX::StrX(&local_7e8,pXVar3);
      pcVar4 = StrX::localForm(&local_7e8);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x7e6,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,local_7d8,lex_iv_1 + 8
            );
      StrX::~StrX(&local_7e8);
      errSeen = true;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_7c0);
    xercesc_4_0::XMLString::release(&local_7d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  return;
}

Assistant:

void test_dt_int()
{
    const XSValue::DataType dt = XSValue::dt_int;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="    1234     \n";

    const char lex_v_ran_v_1[]="+2147483647";
    const char lex_v_ran_v_2[]="-2147483648";
    const char lex_v_ran_iv_1[]="+2147483648";
    const char lex_v_ran_iv_2[]="-2147483649";

    XSValue::XSValue_Data act_v_ran_v_0;   act_v_ran_v_0.fValue.f_int = (int)1234;
    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_int = (int)+2147483647;
    XSValue::XSValue_Data act_v_ran_v_2;   act_v_ran_v_2.fValue.f_int = (int)-2147483648;

    const char lex_v_ran_v_1_canrep[]="2147483647";
    const char lex_v_ran_v_2_canrep[]="-2147483648";
    const char lex_v_ran_iv_1_canrep[]="2147483648";
    const char lex_v_ran_iv_2_canrep[]="-2147483649";

    const char lex_iv_1[]="1234.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.17.2 Canonical representation
 *
 * The canonical representation for int is defined by prohibiting certain options from the
 * Lexical representation (3.3.17.1). Specifically,
 * 1. the the optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="    +12345  \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,        DONT_CARE);
        CANREP_TEST(data_rawstr_2, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,        XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep, DONT_CARE);

        CANREP_TEST(lex_iv_1,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}